

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O2

uint256 * BlockMerkleRoot(uint256 *__return_storage_ptr__,CBlock *block,bool *mutated)

{
  uchar *puVar1;
  pointer psVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  vector<uint256,_std::allocator<uint256>_> hashes;
  pointer puVar7;
  pointer puVar8;
  long lVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  vector<uint256,_std::allocator<uint256>_> leaves;
  undefined8 in_stack_ffffffffffffffa8;
  _Vector_base<uint256,_std::allocator<uint256>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<uint256,_std::allocator<uint256>_>::resize
            ((vector<uint256,_std::allocator<uint256>_> *)&local_38,
             (long)(block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  puVar8 = local_38._M_impl.super__Vector_impl_data._M_finish;
  puVar7 = local_38._M_impl.super__Vector_impl_data._M_start;
  lVar9 = 0;
  for (uVar10 = 0;
      psVar2 = (block->vtx).
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(block->vtx).
                             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4);
      uVar10 = uVar10 + 1) {
    lVar3 = *(long *)((long)&(psVar2->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr + lVar9);
    uVar4 = *(undefined8 *)(lVar3 + 0x39);
    uVar5 = *(undefined8 *)(lVar3 + 0x41);
    uVar6 = *(undefined8 *)(lVar3 + 0x51);
    puVar1 = ((local_38._M_impl.super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data.
             _M_elems + lVar9 * 2 + 0x10;
    *(undefined8 *)puVar1 = *(undefined8 *)(lVar3 + 0x49);
    *(undefined8 *)(puVar1 + 8) = uVar6;
    puVar1 = ((local_38._M_impl.super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data.
             _M_elems + lVar9 * 2;
    *(undefined8 *)puVar1 = uVar4;
    *(undefined8 *)(puVar1 + 8) = uVar5;
    lVar9 = lVar9 + 0x10;
  }
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar7;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffffa8;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar8;
  ComputeMerkleRoot(__return_storage_ptr__,hashes,(bool *)&stack0xffffffffffffffb0);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            ((_Vector_base<uint256,_std::allocator<uint256>_> *)&stack0xffffffffffffffb0);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

uint256 BlockMerkleRoot(const CBlock& block, bool* mutated)
{
    std::vector<uint256> leaves;
    leaves.resize(block.vtx.size());
    for (size_t s = 0; s < block.vtx.size(); s++) {
        leaves[s] = block.vtx[s]->GetHash();
    }
    return ComputeMerkleRoot(std::move(leaves), mutated);
}